

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::~XmlSerializer(XmlSerializer *this)

{
  XmlSerializer *this_local;
  
  std::
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~map(&this->mMatId2MatArray);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector(&this->mMatArray);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector(&this->mMeshes);
  std::
  vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ::~vector(&this->mMetaData);
  return;
}

Assistant:

~XmlSerializer() {
        // empty
    }